

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void jx9RegisterBuiltInFunction(jx9_vm *pVm)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    jx9_create_function(pVm,*(char **)((long)&sjx9Stream.xStat + lVar1),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&aBuiltInFunc[0].zName + lVar1),(void *)0x0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x768);
  lVar1 = 8;
  do {
    jx9_create_function(pVm,*(char **)((long)zEngMonth + lVar1 + 0x58),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&aHashmapFunc[0].zName + lVar1),(void *)0x0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1d8);
  lVar1 = 8;
  do {
    jx9_create_function(pVm,*(char **)((long)&aHashmapFunc[0x1c].xFunc + lVar1),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&jx9RegisterIORoutine_aVfsFunc + lVar1),pVm->pEngine->pVfs);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x3b8);
  lVar1 = 8;
  do {
    jx9_create_function(pVm,*(char **)((long)&PTR_jx9Builtin_zip_entry_compressionmethod_00159a08 +
                                      lVar1),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&jx9RegisterIORoutine_aIOFunc + lVar1),pVm);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1f8);
  jx9_vm_config(pVm,0xb,&sjx9Stream);
  jx9_vm_config(pVm,0xb,&sUnixFileStream);
  return;
}

Assistant:

JX9_PRIVATE void jx9RegisterBuiltInFunction(jx9_vm *pVm)
{
	sxu32 n;
	for( n = 0 ; n < SX_ARRAYSIZE(aBuiltInFunc) ; ++n ){
		jx9_create_function(&(*pVm), aBuiltInFunc[n].zName, aBuiltInFunc[n].xFunc, 0);
	}
	/* Register hashmap functions [i.e: sort(), count(), array_diff(), ...] */
	jx9RegisterHashmapFunctions(&(*pVm));
	/* Register IO functions [i.e: fread(), fwrite(), chdir(), mkdir(), file(), ...] */
	jx9RegisterIORoutine(&(*pVm));
}